

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterDropColumn(Parse *pParse,SrcList *pSrc,Token *pName)

{
  ushort uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Table *pTab;
  Token *zCol;
  Vdbe *p;
  uint uVar7;
  Schema **ppSVar8;
  Index *pIVar9;
  Op *pOVar10;
  short sVar11;
  int p2;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  uint p2_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int p3;
  int regOut;
  short local_78;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    zCol = (Token *)0x0;
    pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTab == (Table *)0x0) goto LAB_00183338;
    iVar3 = isAlterableTable(pParse,pTab);
    if (((iVar3 == 0) && (iVar3 = isRealTable(pParse,pTab,1), iVar3 == 0)) &&
       (zCol = (Token *)sqlite3NameFromToken(db,pName), zCol != (Token *)0x0)) {
      uVar4 = sqlite3ColumnIndex(pTab,(char *)zCol);
      if ((int)uVar4 < 0) {
        pcVar13 = "no such column: \"%T\"";
      }
      else {
        uVar12 = (ulong)uVar4;
        uVar1 = pTab->aCol[uVar12].colFlags;
        if ((uVar1 & 9) != 0) {
          pcVar13 = "PRIMARY KEY";
          if ((uVar1 & 1) == 0) {
            pcVar13 = "UNIQUE";
          }
          sqlite3ErrorMsg(pParse,"cannot drop %s column: \"%s\"",pcVar13,zCol);
          goto LAB_00183338;
        }
        if (1 < pTab->nCol) {
          if (pTab->pSchema == (Schema *)0x0) {
            uVar15 = 0xffff8000;
          }
          else {
            uVar15 = 0xffffffff;
            ppSVar8 = &db->aDb->pSchema;
            do {
              uVar15 = (ulong)((int)uVar15 + 1);
              pSVar2 = *ppSVar8;
              ppSVar8 = ppSVar8 + 4;
            } while (pSVar2 != pTab->pSchema);
          }
          iVar6 = (int)uVar15;
          pcVar13 = db->aDb[iVar6].zDbSName;
          iVar3 = sqlite3AuthCheck(pParse,0x1a,pcVar13,pTab->zName,(char *)zCol);
          if (iVar3 == 0) {
            uVar7 = (uint)(iVar6 == 1);
            renameTestSchema(pParse,pcVar13,uVar7,"",0);
            renameFixQuotes(pParse,pcVar13,uVar7);
            sqlite3NestedParse(pParse,
                               "UPDATE \"%w\".sqlite_master SET sql = sqlite_drop_column(%d, sql, %d) WHERE (type==\'table\' AND tbl_name=%Q COLLATE nocase)"
                               ,pcVar13,uVar15,(ulong)uVar4,pTab->zName);
            renameReloadSchema(pParse,iVar6,2);
            renameTestSchema(pParse,pcVar13,uVar7,"after drop column",1);
            if ((pParse->nErr == 0) && ((pTab->aCol[uVar12].colFlags & 0x20) == 0)) {
              p = sqlite3GetVdbe(pParse);
              iVar3 = pParse->nTab;
              pParse->nTab = iVar3 + 1;
              sqlite3OpenTable(pParse,iVar3,iVar6,pTab,0x71);
              iVar5 = sqlite3VdbeAddOp3(p,0x24,iVar3,0,0);
              iVar6 = pParse->nMem;
              p2 = iVar6 + 1;
              pParse->nMem = p2;
              if ((pTab->tabFlags & 0x80) == 0) {
                sqlite3VdbeAddOp3(p,0x87,iVar3,p2,0);
                pParse->nMem = pParse->nMem + (int)pTab->nCol;
                pIVar9 = (Index *)0x0;
                uVar7 = 0;
              }
              else {
                for (pIVar9 = pTab->pIndex;
                    (pIVar9 != (Index *)0x0 && ((*(ushort *)&pIVar9->field_0x63 & 3) != 2));
                    pIVar9 = pIVar9->pNext) {
                }
                pParse->nMem = (uint)pIVar9->nColumn + p2;
                uVar7 = (uint)pIVar9->nKeyCol;
                if (pIVar9->nKeyCol != 0) {
                  p2_00 = 0;
                  do {
                    sqlite3VdbeAddOp3(p,0x5e,iVar3,p2_00,iVar6 + 2 + p2_00);
                    p2_00 = p2_00 + 1;
                    uVar7 = (uint)pIVar9->nKeyCol;
                  } while (p2_00 < pIVar9->nKeyCol);
                }
              }
              p3 = pParse->nMem + 1;
              pParse->nMem = p3;
              if (0 < pTab->nCol) {
                uVar15 = 0;
                do {
                  if ((uVar15 != uVar12) && ((pTab->aCol[uVar15].colFlags & 0x20) == 0)) {
                    if (pIVar9 == (Index *)0x0) {
                      regOut = iVar6 + 2 + uVar7;
                    }
                    else {
                      uVar16 = (ulong)pIVar9->nColumn;
                      local_78 = -1;
                      uVar14 = 0xffff;
                      if (uVar16 != 0) {
                        uVar14 = 0;
                        do {
                          if (pIVar9->aiColumn[uVar14] == (short)uVar15) goto LAB_001836df;
                          uVar14 = uVar14 + 1;
                        } while (uVar16 != uVar14);
                        uVar14 = 0xffff;
                      }
LAB_001836df:
                      if (uVar16 != 0) {
                        uVar17 = 0;
                        do {
                          if (pIVar9->aiColumn[uVar17] == (short)uVar4) {
                            local_78 = (short)uVar17;
                            break;
                          }
                          uVar17 = uVar17 + 1;
                        } while (uVar16 != uVar17);
                      }
                      sVar11 = (short)uVar14;
                      regOut = (iVar6 + 2 + (int)sVar11) - (uint)(local_78 < sVar11);
                      if ((int)sVar11 < (int)(uint)pIVar9->nKeyCol) goto LAB_0018379f;
                    }
                    if (uVar15 == (uint)(int)pTab->iPKey) {
                      sqlite3VdbeAddOp3(p,0x4b,0,regOut,0);
                    }
                    else {
                      sqlite3ExprCodeGetColumnOfTable(p,pTab,iVar3,(int)uVar15,regOut);
                    }
                    uVar7 = uVar7 + 1;
                  }
LAB_0018379f:
                  uVar15 = uVar15 + 1;
                } while ((long)uVar15 < (long)pTab->nCol);
              }
              if (uVar7 == 0) {
                pParse->nMem = pParse->nMem + 1;
                sqlite3VdbeAddOp3(p,0x4b,0,iVar6 + 2,0);
                uVar7 = 1;
              }
              sqlite3VdbeAddOp3(p,0x61,iVar6 + 2,uVar7,p3);
              if (pIVar9 == (Index *)0x0) {
                sqlite3VdbeAddOp3(p,0x80,iVar3,p3,p2);
              }
              else {
                uVar1 = pIVar9->nKeyCol;
                iVar6 = sqlite3VdbeAddOp3(p,0x8a,iVar3,p3,iVar6 + 2);
                if (p->db->mallocFailed == '\0') {
                  pOVar10 = p->aOp;
                  pOVar10[iVar6].p4type = -3;
                  *(uint *)&pOVar10[iVar6].p4 = (uint)uVar1;
                }
              }
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
              sqlite3VdbeAddOp3(p,0x27,iVar3,iVar5 + 1,0);
              if (p->db->mallocFailed == '\0') {
                pOVar10 = p->aOp + iVar5;
              }
              else {
                pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar10->p2 = p->nOp;
            }
          }
          goto LAB_00183338;
        }
        pcVar13 = "cannot drop column \"%s\": no other columns exist";
        pName = zCol;
      }
      sqlite3ErrorMsg(pParse,pcVar13,pName);
      goto LAB_00183338;
    }
  }
  zCol = (Token *)0x0;
LAB_00183338:
  if (zCol != (Token *)0x0) {
    sqlite3DbFreeNN(db,zCol);
  }
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterDropColumn(Parse *pParse, SrcList *pSrc, const Token *pName){
  sqlite3 *db = pParse->db;       /* Database handle */
  Table *pTab;                    /* Table to modify */
  int iDb;                        /* Index of db containing pTab in aDb[] */
  const char *zDb;                /* Database containing pTab ("main" etc.) */
  char *zCol = 0;                 /* Name of column to drop */
  int iCol;                       /* Index of column zCol in pTab->aCol[] */

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( NEVER(db->mallocFailed) ) goto exit_drop_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_drop_column;

  /* Make sure this is not an attempt to ALTER a view, virtual table or
  ** system table. */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_drop_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 1) ) goto exit_drop_column;

  /* Find the index of the column being dropped. */
  zCol = sqlite3NameFromToken(db, pName);
  if( zCol==0 ){
    assert( db->mallocFailed );
    goto exit_drop_column;
  }
  iCol = sqlite3ColumnIndex(pTab, zCol);
  if( iCol<0 ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pName);
    goto exit_drop_column;
  }

  /* Do not allow the user to drop a PRIMARY KEY column or a column
  ** constrained by a UNIQUE constraint.  */
  if( pTab->aCol[iCol].colFlags & (COLFLAG_PRIMKEY|COLFLAG_UNIQUE) ){
    sqlite3ErrorMsg(pParse, "cannot drop %s column: \"%s\"",
        (pTab->aCol[iCol].colFlags&COLFLAG_PRIMKEY) ? "PRIMARY KEY" : "UNIQUE",
        zCol
    );
    goto exit_drop_column;
  }

  /* Do not allow the number of columns to go to zero */
  if( pTab->nCol<=1 ){
    sqlite3ErrorMsg(pParse, "cannot drop column \"%s\": no other columns exist",zCol);
    goto exit_drop_column;
  }

  /* Edit the sqlite_schema table */
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  zDb = db->aDb[iDb].zDbSName;
#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, zCol) ){
    goto exit_drop_column;
  }
#endif
  renameTestSchema(pParse, zDb, iDb==1, "", 0);
  renameFixQuotes(pParse, zDb, iDb==1);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_drop_column(%d, sql, %d) "
      "WHERE (type=='table' AND tbl_name=%Q COLLATE nocase)"
      , zDb, iDb, iCol, pTab->zName
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iDb, INITFLAG_AlterDrop);
  renameTestSchema(pParse, zDb, iDb==1, "after drop column", 1);

  /* Edit rows of table on disk */
  if( pParse->nErr==0 && (pTab->aCol[iCol].colFlags & COLFLAG_VIRTUAL)==0 ){
    int i;
    int addr;
    int reg;
    int regRec;
    Index *pPk = 0;
    int nField = 0;               /* Number of non-virtual columns after drop */
    int iCur;
    Vdbe *v = sqlite3GetVdbe(pParse);
    iCur = pParse->nTab++;
    sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite);
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    reg = ++pParse->nMem;
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, reg);
      pParse->nMem += pTab->nCol;
    }else{
      pPk = sqlite3PrimaryKeyIndex(pTab);
      pParse->nMem += pPk->nColumn;
      for(i=0; i<pPk->nKeyCol; i++){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, reg+i+1);
      }
      nField = pPk->nKeyCol;
    }
    regRec = ++pParse->nMem;
    for(i=0; i<pTab->nCol; i++){
      if( i!=iCol && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        int regOut;
        if( pPk ){
          int iPos = sqlite3TableColumnToIndex(pPk, i);
          int iColPos = sqlite3TableColumnToIndex(pPk, iCol);
          if( iPos<pPk->nKeyCol ) continue;
          regOut = reg+1+iPos-(iPos>iColPos);
        }else{
          regOut = reg+1+nField;
        }
        if( i==pTab->iPKey ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, regOut);
        }else{
          sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOut);
        }
        nField++;
      }
    }
    if( nField==0 ){
      /* dbsqlfuzz 5f09e7bcc78b4954d06bf9f2400d7715f48d1fef */
      pParse->nMem++;
      sqlite3VdbeAddOp2(v, OP_Null, 0, reg+1);
      nField = 1;
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg+1, nField, regRec);
    if( pPk ){
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iCur, regRec, reg+1, pPk->nKeyCol);
    }else{
      sqlite3VdbeAddOp3(v, OP_Insert, iCur, regRec, reg);
    }
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);

    sqlite3VdbeAddOp2(v, OP_Next, iCur, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
  }

exit_drop_column:
  sqlite3DbFree(db, zCol);
  sqlite3SrcListDelete(db, pSrc);
}